

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

void draw_tilemap_reg(dbg_layer_t layer)

{
  ushort uVar1;
  byte bVar2;
  int x_1;
  uint uVar3;
  uint uVar4;
  BGCNT_t *pBVar5;
  long lVar6;
  int x;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  gba_color_t line [1024];
  ushort auStack_838 [1028];
  
  uVar3 = get_tilemap_x(layer);
  uVar4 = get_tilemap_y(layer);
  pBVar5 = get_bgcnt(layer);
  uVar9 = 0;
  memset(dbg_tilemap,0,0x400000);
  lVar8 = 0x1441b3;
  do {
    uVar7 = 0;
    do {
      if ((uVar7 <= uVar3) && (uVar9 <= uVar4)) {
        (*(code *)(&DAT_00126ef4 + *(int *)(&DAT_00126ef4 + (ulong)(pBVar5->raw >> 0xe) * 4)))();
        return;
      }
      auStack_838[uVar7] = auStack_838[uVar7] & 0x8000;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x400);
    lVar6 = 0;
    do {
      uVar1 = auStack_838[lVar6];
      *(byte *)(lVar8 + -2 + lVar6 * 4) = ((byte)uVar1 & 7) + (byte)uVar1 * '\b';
      bVar2 = (byte)(uVar1 >> 5);
      *(byte *)(lVar8 + -1 + lVar6 * 4) = (bVar2 & 7) + bVar2 * '\b';
      bVar2 = (byte)(uVar1 >> 8);
      *(byte *)(lVar8 + lVar6 * 4) = (bVar2 >> 2 & 7) + (bVar2 >> 2) * '\b';
      *(undefined1 *)(lVar8 + -3 + lVar6 * 4) = 0xff;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x400);
    uVar9 = uVar9 + 1;
    lVar8 = lVar8 + 0x1000;
  } while (uVar9 != 0x400);
  SDL_UpdateTexture(dbg_tilemap_texture,0,dbg_tilemap,0x1000);
  return;
}

Assistant:

void draw_tilemap_reg(dbg_layer_t layer) {
    int tilemap_size_x = get_tilemap_x(layer);
    int tilemap_size_y = get_tilemap_y(layer);
    BGCNT_t* bgcnt = get_bgcnt(layer);

    word character_base_addr = bgcnt->character_base_block * CHARBLOCK_SIZE;
    word screen_base_addr = bgcnt->screen_base_block * SCREENBLOCK_SIZE;

    memset(dbg_tilemap, 0, sizeof(color_t) * MAX_TILEMAP_SIZE_X * MAX_TILEMAP_SIZE_Y);

    gba_color_t line[MAX_TILEMAP_SIZE_X];
    for (int y = 0; y < MAX_TILEMAP_SIZE_Y; y++) {
        for (int x = 0; x < MAX_TILEMAP_SIZE_X; x++) {
            if (x > tilemap_size_x || y > tilemap_size_y) {
                line[x].r = 0;
                line[x].g = 0;
                line[x].b = 0;
                continue;
            }
            int screenblock_number;
            switch (bgcnt->screen_size) {
                case 0:
                    // 0
                    screenblock_number = 0;
                    break;
                case 1:
                    // 0 1
                    screenblock_number = (x % 512) > 255 ? 1 : 0;
                    break;
                case 2:
                    // 0
                    // 1
                    screenblock_number = (y % 512) > 255 ? 1 : 0;
                    break;
                case 3:
                    // 0 1
                    // 2 3
                    screenblock_number = (x % 512) > 255 ? 1 : 0;
                    screenblock_number += (y % 512) > 255 ? 2 : 0;
                    break;
                default:
                    logfatal("Unimplemented screen size: %d", bgcnt->screen_size);

            }
            int tilemap_x = x % 256;
            int tilemap_y = y % 256;

            int se_number = (tilemap_x / 8) + (tilemap_y / 8) * 32;
            reg_se_t se;
            se.raw = half_from_byte_array(ppu->vram, (screen_base_addr + screenblock_number * SCREENBLOCK_SIZE + se_number * 2));
            dbg_render_screenentry(ppu, &line, x, se, bgcnt->is_256color, character_base_addr, tilemap_x, tilemap_y);
        }

        for (int x = 0; x < MAX_TILEMAP_SIZE_X; x++) {
            dbg_tilemap[y][x].r = FIVEBIT_TO_EIGHTBIT_COLOR(line[x].r);
            dbg_tilemap[y][x].g = FIVEBIT_TO_EIGHTBIT_COLOR(line[x].g);
            dbg_tilemap[y][x].b = FIVEBIT_TO_EIGHTBIT_COLOR(line[x].b);
            dbg_tilemap[y][x].a = 0xFF;
        }
    }

    SDL_UpdateTexture(dbg_tilemap_texture, NULL, dbg_tilemap, MAX_TILEMAP_SIZE_X * 4);
}